

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVStreambuf.h
# Opt level: O0

int __thiscall
cmBasicUVStreambuf<char,_std::char_traits<char>_>::close
          (cmBasicUVStreambuf<char,_std::char_traits<char>_> *this,int __fd)

{
  char *pcVar1;
  size_type sVar2;
  char *readEnd;
  cmBasicUVStreambuf<char,_std::char_traits<char>_> *this_local;
  
  if (this->Stream != (uv_stream_t *)0x0) {
    uv_read_stop(this->Stream);
    this->Stream->data = this->OldStreamData;
  }
  this->Stream = (uv_stream_t *)0x0;
  pcVar1 = std::vector<char,_std::allocator<char>_>::data(&this->InputBuffer);
  sVar2 = std::vector<char,_std::allocator<char>_>::size(&this->InputBuffer);
  std::streambuf::setg((char *)this,pcVar1 + sVar2,pcVar1 + sVar2);
  return (int)this;
}

Assistant:

cmBasicUVStreambuf<CharT, Traits>* cmBasicUVStreambuf<CharT, Traits>::close()
{
  if (this->Stream) {
    uv_read_stop(this->Stream);
    this->Stream->data = this->OldStreamData;
  }
  this->Stream = nullptr;
  CharT* readEnd = this->InputBuffer.data() + this->InputBuffer.size();
  this->setg(readEnd, readEnd, readEnd);
  return this;
}